

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O3

void trsort64(saidx64_t *ISA,saidx64_t *SA,saidx64_t n,saidx64_t depth)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  saint_t sVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong *extraout_RDX;
  ulong *puVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong *ISAd;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  saidx64_t sVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  ulong *puVar36;
  ulong uVar37;
  ulong uVar38;
  anon_struct_32_5_90aca025_conflict stack [96];
  long local_cf0;
  long local_cc8;
  ulong *local_cc0;
  ulong local_cb8;
  ulong *local_cb0;
  saidx64_t *local_ca8;
  ulong *local_ca0;
  ulong *local_c98;
  long local_c90;
  long local_c88;
  ulong local_c80;
  ulong local_c78;
  ulong *local_c70 [2];
  undefined8 local_c60;
  ulong *local_c58 [3];
  ulong *local_c40;
  uint uStack_c3c;
  ulong local_c38 [3];
  ulong auStack_c20 [4];
  uint auStack_c00 [756];
  
  if ((ulong)n >> 0x20 == 0) {
    if ((ulong)n < 0x10000) {
      if ((ulong)n < 0x100) {
        sVar9 = lg_table[n];
      }
      else {
        sVar9 = lg_table[(ulong)n >> 8] + 8;
      }
    }
    else if ((ulong)n < 0x1000000) {
      sVar9 = lg_table[(ulong)n >> 0x10] + 0x10;
    }
    else {
      sVar9 = lg_table[(ulong)n >> 0x18] + 0x18;
    }
  }
  else if ((ulong)n < 0x1000000000000) {
    if ((ulong)n >> 0x28 == 0) {
      sVar9 = lg_table[(ulong)n >> 0x20] + 0x20;
    }
    else {
      sVar9 = lg_table[(ulong)n >> 0x28] + 0x28;
    }
  }
  else if ((ulong)n >> 0x38 == 0) {
    sVar9 = lg_table[(ulong)n >> 0x30] + 0x30;
  }
  else {
    sVar9 = lg_table[(ulong)n >> 0x38] + 0x38;
  }
  local_c78 = -n;
  uVar6 = *SA;
  if (uVar6 == local_c78 || SBORROW8(uVar6,local_c78) != (long)(uVar6 + n) < 0) {
    return;
  }
  puVar10 = (ulong *)(ISA + depth);
  local_cf0 = (long)((sVar9 * 2) / 3);
  local_c58[1] = (ulong *)(SA + 1);
  puVar7 = (ulong *)(SA + n);
  local_c90 = -(long)SA;
  sVar30 = n;
  local_ca8 = ISA;
  local_c70[0] = puVar7;
LAB_00117c26:
  lVar13 = (long)puVar10 - (long)ISA >> 3;
  puVar14 = (ulong *)-lVar13;
  uVar12 = 0;
  local_c88 = 0;
  local_c60 = (ulong *)SA;
  local_c70[1] = puVar10;
  local_c58[2] = puVar14;
  do {
    if ((long)uVar6 < 0) {
      puVar14 = (ulong *)(uVar6 * 8);
      local_c58[0] = local_c60 + -uVar6;
      uVar12 = uVar12 + uVar6;
LAB_001199dc:
      if (puVar7 <= local_c58[0]) break;
    }
    else {
      if (uVar12 != 0) {
        local_c60[uVar12] = uVar12;
      }
      local_c58[0] = local_c58[1] + ISA[uVar6];
      uVar6 = (long)local_c58[0] - (long)local_c60;
      if ((long)uVar6 < 9) {
        uVar12 = -(ulong)(uVar6 == 8);
        goto LAB_001199dc;
      }
      local_cb0 = (ulong *)(uVar6 >> 0x23);
      if (local_cb0 == (ulong *)0x0) {
        if (uVar6 < 0x80000) {
          if (uVar6 < 0x800) {
            local_cb0 = (ulong *)lg_table;
            uVar33 = lg_table[uVar6 >> 3];
          }
          else {
            local_cb0 = (ulong *)lg_table;
            uVar33 = lg_table[uVar6 >> 0xb] + 8;
          }
        }
        else if (uVar6 < 0x8000000) {
          local_cb0 = (ulong *)lg_table;
          uVar33 = lg_table[uVar6 >> 0x13] + 0x10;
        }
        else {
          local_cb0 = (ulong *)lg_table;
          uVar33 = lg_table[uVar6 >> 0x1b] + 0x18;
        }
      }
      else {
        puVar14 = (ulong *)(uVar6 >> 0x33);
        if (puVar14 == (ulong *)0x0) {
          if (uVar6 >> 0x2b == 0) {
            uVar33 = lg_table[(long)local_cb0] + 0x20;
          }
          else {
            local_cb0 = (ulong *)lg_table;
            uVar33 = lg_table[uVar6 >> 0x2b] + 0x28;
          }
        }
        else if (uVar6 >> 0x3b == 0) {
          uVar33 = lg_table[(long)puVar14] + 0x30;
        }
        else {
          local_cb0 = (ulong *)lg_table;
          uVar33 = lg_table[uVar6 >> 0x3b] + 0x38;
        }
      }
      uVar19 = 0xffffffff;
      local_cc8 = 0;
      puVar7 = local_c60;
      puVar23 = local_c58[0];
      uVar6 = 0;
LAB_00117da3:
      while (uVar12 = uVar6, puVar24 = puVar23, puVar36 = puVar7, ISAd = puVar10, puVar17 = puVar14,
            uVar5 = (uint)uVar12, puVar10 = ISAd, uVar6 = uVar12, puVar7 = local_cb0,
            (int)uVar33 < 0) {
        if (uVar33 == 0xfffffffe) {
          lVar8 = (long)(int)uVar5;
          puVar7 = local_c58[lVar8 * 4 + 1];
          local_cb0 = local_c58[lVar8 * 4 + 2];
          puVar14 = local_cb0;
          if ((int)local_c38[lVar8 * 4 + -1] == 0) {
            lVar18 = (long)ISAd - (long)ISA >> 3;
            lVar21 = ((long)local_cb0 - (long)SA >> 3) + -1;
            puVar10 = puVar7 + -1;
            if (puVar36 <= puVar10) {
              do {
                uVar6 = *puVar36 - lVar18;
                if ((-1 < (long)uVar6) && (ISA[uVar6] == lVar21)) {
                  puVar10[1] = uVar6;
                  puVar10 = puVar10 + 1;
                  ISA[uVar6] = (long)puVar10 - (long)SA >> 3;
                }
                puVar36 = puVar36 + 1;
              } while (puVar36 <= puVar10);
            }
            while (puVar10 + 1 < puVar14) {
              puVar24 = puVar24 + -1;
              uVar6 = *puVar24 - lVar18;
              if ((-1 < (long)uVar6) && (ISA[uVar6] == lVar21)) {
                puVar14[-1] = uVar6;
                puVar14 = puVar14 + -1;
                ISA[uVar6] = (long)puVar14 - (long)SA >> 3;
              }
            }
          }
          else {
            if (-1 < (int)uVar19) {
              *(undefined4 *)(auStack_c20 + (ulong)uVar19 * 4) = 0xffffffff;
            }
            lVar21 = (long)ISAd - (long)ISA >> 3;
            lVar35 = ((long)local_cb0 - (long)SA >> 3) + -1;
            puVar10 = puVar7 + -1;
            lVar18 = -1;
            if (puVar36 <= puVar10) {
              puVar23 = puVar36;
              lVar25 = -1;
              do {
                uVar6 = *puVar23;
                uVar22 = uVar6 - lVar21;
                lVar29 = lVar25;
                if ((-1 < (long)uVar22) && (ISA[uVar22] == lVar35)) {
                  puVar10[1] = uVar22;
                  puVar10 = puVar10 + 1;
                  lVar29 = ISA[uVar6];
                  if (lVar25 != lVar29) {
                    lVar18 = (long)puVar10 - (long)SA >> 3;
                  }
                  ISA[uVar22] = lVar18;
                }
                puVar23 = puVar23 + 1;
                lVar25 = lVar29;
              } while (puVar23 <= puVar10);
            }
            if (puVar36 <= puVar10) {
              lVar28 = local_c90 + (long)puVar10;
              lVar25 = lVar18;
              lVar29 = -1;
              puVar23 = puVar10;
              do {
                lVar1 = ISA[*puVar23];
                lVar18 = lVar28 >> 3;
                if (lVar29 == lVar1) {
                  lVar18 = lVar25;
                }
                if (lVar18 != lVar1) {
                  ISA[*puVar23] = lVar18;
                }
                puVar23 = puVar23 + -1;
                lVar28 = lVar28 + -8;
                lVar25 = lVar18;
                lVar29 = lVar1;
              } while (puVar36 <= puVar23);
            }
            if (puVar10 + 1 < local_cb0) {
              lVar25 = -1;
              do {
                puVar24 = puVar24 + -1;
                uVar6 = *puVar24;
                uVar22 = uVar6 - lVar21;
                lVar29 = lVar25;
                if ((-1 < (long)uVar22) && (ISA[uVar22] == lVar35)) {
                  puVar14[-1] = uVar22;
                  puVar14 = puVar14 + -1;
                  lVar29 = ISA[uVar6];
                  if (lVar25 != lVar29) {
                    lVar18 = (long)puVar14 - (long)SA >> 3;
                  }
                  ISA[uVar22] = lVar18;
                }
                lVar25 = lVar29;
              } while (puVar10 + 1 < puVar14);
            }
          }
          local_cb8 = uVar12;
          if (uVar5 == 1) goto LAB_0011999f;
          uVar19 = *(uint *)((long)&local_c60 + lVar8 * 0x20 + 4);
          puVar14 = puVar7;
          puVar10 = (ulong *)(&local_c78)[lVar8 * 4];
          puVar7 = local_c70[lVar8 * 4];
          puVar23 = local_c70[lVar8 * 4 + 1];
          uVar6 = (ulong)(uVar5 - 2);
          uVar33 = *(uint *)(&local_c60 + lVar8 * 4);
        }
        else {
          if (uVar33 != 0xffffffff) goto LAB_00118e05;
          puVar7 = ISAd + (long)local_c58[2];
          local_cc0 = puVar17;
          tr_partition((saidx64_t *)puVar7,(saidx64_t *)puVar36,(saidx64_t *)puVar36,
                       (saidx64_t *)puVar24,(saidx64_t **)&local_cc0,(saidx64_t **)&local_cb0,
                       ((long)puVar24 - (long)SA >> 3) + -1);
          if ((local_cc0 < puVar24) && (puVar36 < local_cc0)) {
            puVar10 = puVar36;
            do {
              ISA[*puVar10] = ((long)local_cc0 - (long)SA >> 3) + -1;
              puVar10 = puVar10 + 1;
            } while (puVar10 < local_cc0);
          }
          if ((local_cb0 < puVar24) && (local_cc0 < local_cb0)) {
            puVar10 = local_cc0;
            do {
              ISA[*puVar10] = ((long)local_cb0 - (long)SA >> 3) + -1;
              puVar10 = puVar10 + 1;
            } while (puVar10 < local_cb0);
          }
          if (8 < (long)local_cb0 - (long)local_cc0) {
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = 0;
            local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
            auStack_c20[lVar8 * 4] = 0;
            auStack_c20[lVar8 * 4 + 1] = (ulong)puVar7;
            auStack_c20[lVar8 * 4 + 2] = (ulong)puVar36;
            *(ulong **)(auStack_c00 + lVar8 * 8 + -2) = puVar24;
            auStack_c00[lVar8 * 8] = 0xfffffffe;
            auStack_c00[lVar8 * 8 + 1] = uVar19;
            uVar19 = uVar5;
            uVar5 = uVar5 + 2;
          }
          uVar6 = (long)local_cc0 - (long)puVar36 >> 3;
          uVar12 = (long)puVar24 - (long)local_cb0 >> 3;
          ISA = local_ca8;
          if ((long)uVar12 < (long)uVar6) {
            if ((long)uVar12 < 2) {
              if ((long)uVar6 < 2) {
LAB_00118aac:
                puVar14 = local_cb0;
                if (uVar5 == 0) goto LAB_0011999f;
                lVar8 = (long)(int)uVar5;
                uVar5 = uVar5 - 1;
                ISAd = local_c58[lVar8 * 4];
                uVar33 = (uint)local_c38[lVar8 * 4 + -1];
                uVar19 = *(uint *)((long)local_c38 + lVar8 * 0x20 + -4);
                puVar36 = local_c58[lVar8 * 4 + 1];
                puVar24 = local_c58[lVar8 * 4 + 2];
              }
              else if (uVar6 >> 0x20 == 0) {
                if (uVar6 < 0x10000) goto LAB_001198be;
LAB_00118a3a:
                if (uVar6 < 0x1000000) {
                  uVar33 = lg_table[uVar6 >> 0x10] + 0x10;
                  puVar24 = local_cc0;
                }
                else {
                  uVar33 = lg_table[uVar6 >> 0x18] + 0x18;
                  puVar24 = local_cc0;
                }
              }
              else {
                if (uVar6 < 0x1000000000000) goto LAB_001198ec;
LAB_001193c3:
                if (uVar6 < 0x100000000000000) {
                  uVar33 = lg_table[uVar6 >> 0x30] + 0x30;
                  puVar24 = local_cc0;
                }
                else {
                  uVar33 = lg_table[uVar6 >> 0x38] + 0x38;
                  puVar24 = local_cc0;
                }
              }
            }
            else {
              lVar8 = (long)(int)uVar5;
              local_c38[lVar8 * 4] = (ulong)ISAd;
              local_c38[lVar8 * 4 + 1] = (ulong)puVar36;
              auStack_c20[lVar8 * 4 + -1] = (ulong)local_cc0;
              if (uVar6 >> 0x20 == 0) {
                if (uVar6 < 0x10000) {
                  if (uVar6 < 0x100) {
                    sVar9 = lg_table[uVar6];
                  }
                  else {
                    sVar9 = lg_table[uVar6 >> 8] + 8;
                  }
                }
                else if (uVar6 < 0x1000000) {
                  sVar9 = lg_table[uVar6 >> 0x10] + 0x10;
                }
                else {
                  sVar9 = lg_table[uVar6 >> 0x18] + 0x18;
                }
              }
              else if (uVar6 < 0x1000000000000) {
                if (uVar6 < 0x10000000000) {
                  sVar9 = lg_table[uVar6 >> 0x20] + 0x20;
                }
                else {
                  sVar9 = lg_table[uVar6 >> 0x28] + 0x28;
                }
              }
              else if (uVar6 < 0x100000000000000) {
                sVar9 = lg_table[uVar6 >> 0x30] + 0x30;
              }
              else {
                sVar9 = lg_table[uVar6 >> 0x38] + 0x38;
              }
              *(saint_t *)(auStack_c20 + lVar8 * 4) = sVar9;
              uVar5 = uVar5 + 1;
              *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
joined_r0x00118a71:
              puVar36 = local_cb0;
              if (uVar12 >> 0x20 == 0) {
                if (uVar12 < 0x10000) {
                  if (uVar12 < 0x100) {
                    uVar33 = lg_table[uVar12];
                  }
                  else {
                    uVar33 = lg_table[uVar12 >> 8] + 8;
                  }
                }
                else if (uVar12 < 0x1000000) {
                  uVar33 = lg_table[uVar12 >> 0x10] + 0x10;
                }
                else {
                  uVar33 = lg_table[uVar12 >> 0x18] + 0x18;
                }
              }
              else if (uVar12 < 0x1000000000000) {
                if (uVar12 < 0x10000000000) {
                  uVar33 = lg_table[uVar12 >> 0x20] + 0x20;
                }
                else {
                  uVar33 = lg_table[uVar12 >> 0x28] + 0x28;
                }
              }
              else if (uVar12 < 0x100000000000000) {
                uVar33 = lg_table[uVar12 >> 0x30] + 0x30;
              }
              else {
                uVar33 = lg_table[uVar12 >> 0x38] + 0x38;
              }
            }
          }
          else {
            if ((long)uVar6 < 2) {
              if ((long)uVar12 < 2) goto LAB_00118aac;
              goto joined_r0x00118a71;
            }
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = (ulong)ISAd;
            local_c38[lVar8 * 4 + 1] = (ulong)local_cb0;
            auStack_c20[lVar8 * 4 + -1] = (ulong)puVar24;
            if (uVar12 >> 0x20 == 0) {
              if (uVar12 < 0x10000) {
                if (uVar12 < 0x100) {
                  sVar9 = lg_table[uVar12];
                }
                else {
                  sVar9 = lg_table[uVar12 >> 8] + 8;
                }
              }
              else if (uVar12 < 0x1000000) {
                sVar9 = lg_table[uVar12 >> 0x10] + 0x10;
              }
              else {
                sVar9 = lg_table[uVar12 >> 0x18] + 0x18;
              }
            }
            else if (uVar12 < 0x1000000000000) {
              if (uVar12 < 0x10000000000) {
                sVar9 = lg_table[uVar12 >> 0x20] + 0x20;
              }
              else {
                sVar9 = lg_table[uVar12 >> 0x28] + 0x28;
              }
            }
            else if (uVar12 < 0x100000000000000) {
              sVar9 = lg_table[uVar12 >> 0x30] + 0x30;
            }
            else {
              sVar9 = lg_table[uVar12 >> 0x38] + 0x38;
            }
            *(saint_t *)(auStack_c20 + lVar8 * 4) = sVar9;
            uVar5 = uVar5 + 1;
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
            if (uVar6 >> 0x20 == 0) {
              if (0xffff < uVar6) goto LAB_00118a3a;
LAB_001198be:
              if (uVar6 < 0x100) {
                uVar33 = lg_table[uVar6];
                puVar24 = local_cc0;
              }
              else {
                uVar33 = lg_table[uVar6 >> 8] + 8;
                puVar24 = local_cc0;
              }
            }
            else {
              if (0xffffffffffff < uVar6) goto LAB_001193c3;
LAB_001198ec:
              if (uVar6 < 0x10000000000) {
                uVar33 = lg_table[uVar6 >> 0x20] + 0x20;
                puVar24 = local_cc0;
              }
              else {
                uVar33 = lg_table[uVar6 >> 0x28] + 0x28;
                puVar24 = local_cc0;
              }
            }
          }
          puVar14 = local_cc0;
          puVar10 = ISAd;
          puVar7 = puVar36;
          puVar23 = puVar24;
          uVar6 = (ulong)uVar5;
        }
      }
      uVar22 = (long)puVar24 - (long)puVar36;
      uVar37 = (long)uVar22 >> 3;
      puVar14 = puVar36;
      if ((long)uVar37 < 9) {
        while (puVar10 = puVar14 + 1, puVar10 < puVar24) {
          uVar15 = *puVar14;
          uVar22 = puVar14[1];
          uVar27 = ISAd[uVar15];
          uVar37 = ISAd[uVar22];
          while (puVar23 = puVar14, (long)uVar37 < (long)uVar27) {
            do {
              puVar14 = puVar23 + -1;
              puVar23[1] = uVar15;
              if (puVar14 < puVar36) goto LAB_00117e33;
              uVar15 = *puVar14;
              puVar23 = puVar14;
            } while ((long)uVar15 < 0);
            uVar27 = ISAd[uVar15];
            uVar37 = ISAd[uVar22];
          }
LAB_00117e33:
          if (uVar37 == uVar27) {
            *puVar14 = ~*puVar14;
          }
          puVar14[1] = uVar22;
          puVar14 = puVar10;
          local_cb8 = uVar12;
        }
LAB_00118e05:
        local_cb0 = puVar7;
        uVar22 = *puVar36;
        local_cc0 = puVar17;
        if (-1 < (long)uVar22) {
          lVar8 = local_c90 + (long)puVar36;
          puVar17 = puVar36 + 1;
          do {
            puVar36 = puVar17;
            puVar17 = (ulong *)(lVar8 >> 3);
            ISA[uVar22] = (saidx64_t)puVar17;
            local_cc0 = puVar36;
            if (puVar24 <= puVar36) break;
            uVar22 = *puVar36;
            puVar17 = puVar36 + 1;
            lVar8 = lVar8 + 8;
          } while (-1 < (long)uVar22);
        }
        if (puVar36 < puVar24) {
          uVar22 = *puVar36;
          lVar8 = 8;
          do {
            lVar18 = lVar8;
            *(ulong *)((long)puVar36 + lVar18 + -8) = ~uVar22;
            uVar22 = *(ulong *)((long)puVar36 + lVar18);
            lVar8 = lVar18 + 8;
          } while ((long)uVar22 < 0);
          uVar33 = 0xffffffff;
          if (ISA[uVar22] != ISAd[uVar22]) {
            uVar22 = (lVar18 >> 3) + 1;
            if (uVar22 >> 0x20 == 0) {
              if (uVar22 < 0x10000) {
                if (uVar22 < 0x100) {
                  uVar33 = lg_table[(lVar18 >> 3) + 1];
                }
                else {
                  uVar33 = lg_table[uVar22 >> 8] + 8;
                }
              }
              else if (uVar22 < 0x1000000) {
                uVar33 = lg_table[uVar22 >> 0x10] + 0x10;
              }
              else {
                uVar33 = lg_table[uVar22 >> 0x18] + 0x18;
              }
            }
            else if (uVar22 < 0x1000000000000) {
              if (uVar22 < 0x10000000000) {
                uVar33 = lg_table[uVar22 >> 0x20] + 0x20;
              }
              else {
                uVar33 = lg_table[uVar22 >> 0x28] + 0x28;
              }
            }
            else if (uVar22 < 0x100000000000000) {
              uVar33 = lg_table[uVar22 >> 0x30] + 0x30;
            }
            else {
              uVar33 = lg_table[uVar22 >> 0x38] + 0x38;
            }
          }
          local_cc0 = (ulong *)((long)puVar36 + lVar8);
          if ((local_cc0 < puVar24) && (local_cb0 = puVar36, puVar36 < local_cc0)) {
            do {
              ISA[*local_cb0] = ((long)puVar36 + lVar8 + local_c90 >> 3) + -1;
              local_cb0 = local_cb0 + 1;
            } while (local_cb0 < local_cc0);
          }
          lVar18 = lVar8 >> 3;
          puVar14 = local_cc0;
          if (sVar30 < lVar18) {
            if (local_cf0 != 0) {
              sVar30 = sVar30 + n;
              local_cf0 = local_cf0 + -1;
              goto LAB_00118eed;
            }
            if (-1 < (int)uVar19) {
              *(undefined4 *)(auStack_c20 + (ulong)uVar19 * 4) = 0xffffffff;
            }
            local_cc8 = local_cc8 + lVar18;
            puVar14 = (ulong *)((long)puVar24 + (-lVar8 - (long)puVar36));
            if ((long)puVar14 < 9) {
              if (uVar5 != 0) goto LAB_001190bc;
              local_cf0 = 0;
              goto LAB_0011999f;
            }
            local_cf0 = 0;
          }
          else {
LAB_00118eed:
            sVar30 = sVar30 - lVar18;
            lVar18 = (long)puVar24 + (-lVar8 - (long)puVar36);
            puVar7 = puVar36;
            puVar23 = local_cc0;
            if (lVar8 <= lVar18) {
              lVar8 = (long)(int)uVar5;
              local_c38[lVar8 * 4] = (ulong)ISAd;
              local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
              auStack_c20[lVar8 * 4 + -1] = (ulong)puVar24;
              *(undefined4 *)(auStack_c20 + lVar8 * 4) = 0xfffffffd;
              *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
              puVar10 = ISAd + lVar13;
              uVar6 = (ulong)(uVar5 + 1);
              goto LAB_00117da3;
            }
            puVar10 = ISAd + lVar13;
            if (lVar18 < 9) goto LAB_00117da3;
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
            local_c38[lVar8 * 4 + 1] = (ulong)puVar36;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_cc0;
            *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
            uVar12 = (ulong)(uVar5 + 1);
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
          }
          puVar14 = local_cc0;
          puVar10 = ISAd;
          puVar7 = local_cc0;
          puVar23 = puVar24;
          uVar6 = uVar12;
          uVar33 = 0xfffffffd;
          goto LAB_00117da3;
        }
LAB_0011916e:
        puVar14 = puVar17;
        if (uVar5 == 0) goto LAB_0011999f;
        lVar8 = (long)(int)uVar5;
        uVar19 = *(uint *)((long)local_c38 + lVar8 * 0x20 + -4);
        puVar14 = local_cc0;
        puVar10 = local_c58[lVar8 * 4];
        puVar7 = local_c58[lVar8 * 4 + 1];
        puVar23 = local_c58[lVar8 * 4 + 2];
        uVar6 = (ulong)(uVar5 - 1);
        uVar33 = (uint)local_c38[lVar8 * 4 + -1];
        goto LAB_00117da3;
      }
      puVar14 = puVar24 + -1;
      local_ca0 = puVar24;
      if (uVar33 == 0) {
        if ((uVar22 & 8) == 0) {
          uVar27 = uVar37 - 1;
          uVar15 = uVar27 >> 1;
          uVar31 = puVar36[uVar37 - 1];
          if ((long)ISAd[puVar36[uVar15]] < (long)ISAd[uVar31]) {
            puVar36[uVar37 - 1] = puVar36[uVar15];
            puVar36[uVar15] = uVar31;
          }
        }
        else {
          uVar15 = uVar37 >> 1;
          uVar27 = uVar37;
        }
        do {
          uVar26 = uVar15 - 1;
          uVar31 = puVar36[uVar15 - 1];
          uVar37 = uVar15 * 2 - 1;
          uVar38 = uVar26;
          if ((long)uVar37 < (long)uVar27) {
            uVar11 = ISAd[uVar31];
            lVar8 = uVar15 * 2 + -2;
            uVar34 = uVar26;
            do {
              uVar2 = ISAd[puVar36[uVar37]];
              uVar3 = ISAd[puVar36[lVar8 + 2]];
              uVar20 = uVar3;
              if ((long)uVar3 < (long)uVar2) {
                uVar20 = uVar2;
              }
              uVar38 = uVar34;
              if ((long)uVar20 <= (long)uVar11) break;
              uVar38 = uVar37;
              if ((long)uVar2 < (long)uVar3) {
                uVar38 = lVar8 + 2;
              }
              puVar36[uVar34] = puVar36[uVar38];
              lVar8 = uVar38 * 2;
              uVar37 = uVar38 * 2 + 1;
              uVar34 = uVar38;
            } while ((long)uVar37 < (long)uVar27);
          }
          puVar36[uVar38] = uVar31;
          bVar4 = 1 < (long)uVar15;
          uVar15 = uVar26;
        } while (bVar4);
        if ((uVar22 & 8) == 0) {
          uVar22 = *puVar36;
          *puVar36 = puVar36[uVar27];
          puVar36[uVar27] = uVar22;
          uVar22 = *puVar36;
          if ((long)uVar27 < 2) {
            lVar8 = 0;
          }
          else {
            uVar37 = ISAd[uVar22];
            lVar18 = 1;
            lVar21 = 0;
            lVar35 = 0;
            do {
              uVar15 = ISAd[puVar36[lVar18]];
              uVar31 = ISAd[puVar36[lVar21 + 2]];
              uVar38 = uVar31;
              if ((long)uVar31 < (long)uVar15) {
                uVar38 = uVar15;
              }
              lVar8 = lVar35;
              if ((long)uVar38 <= (long)uVar37) break;
              lVar8 = lVar18;
              if ((long)uVar15 < (long)uVar31) {
                lVar8 = lVar21 + 2;
              }
              puVar36[lVar35] = puVar36[lVar8];
              lVar21 = lVar8 * 2;
              lVar18 = lVar8 * 2 + 1;
              lVar35 = lVar8;
            } while (lVar18 < (long)uVar27);
          }
          puVar36[lVar8] = uVar22;
        }
        if (1 < (long)uVar27) {
          uVar22 = *puVar36;
          puVar10 = puVar36 + (uVar27 - 1);
          uVar37 = *puVar10;
          *puVar36 = uVar37;
          while (uVar15 = uVar27 - 1, 1 < uVar15) {
            uVar31 = ISAd[uVar37];
            lVar8 = 1;
            lVar18 = 0;
            lVar21 = 0;
            do {
              uVar38 = ISAd[puVar36[lVar8]];
              uVar26 = ISAd[puVar36[lVar18 + 2]];
              uVar11 = uVar26;
              if ((long)uVar26 < (long)uVar38) {
                uVar11 = uVar38;
              }
              lVar35 = lVar21;
              if ((long)uVar11 <= (long)uVar31) break;
              lVar35 = lVar8;
              if ((long)uVar38 < (long)uVar26) {
                lVar35 = lVar18 + 2;
              }
              puVar36[lVar21] = puVar36[lVar35];
              lVar18 = lVar35 * 2;
              lVar8 = lVar35 * 2 + 1;
              lVar21 = lVar35;
            } while (lVar8 < (long)uVar15);
            puVar36[lVar35] = uVar37;
            *puVar10 = uVar22;
            uVar22 = *puVar36;
            puVar10 = puVar36 + (uVar27 - 2);
            uVar37 = *puVar10;
            *puVar36 = uVar37;
            uVar27 = uVar15;
          }
          *puVar10 = uVar22;
        }
joined_r0x00118db5:
        puVar17 = puVar14;
        ISA = local_ca8;
        local_cb8 = uVar12;
        local_c98 = local_cb0;
        if (puVar36 < puVar17) {
          puVar7 = puVar17 + -1;
          puVar14 = puVar7;
          if (puVar36 <= puVar7) {
            uVar22 = ISAd[*puVar17];
            do {
              puVar14 = puVar7;
              if (ISAd[*puVar7] != uVar22) break;
              *puVar7 = ~*puVar7;
              puVar7 = puVar7 + -1;
              puVar14 = puVar7;
            } while (puVar36 <= puVar7);
          }
          goto joined_r0x00118db5;
        }
        goto LAB_00118e05;
      }
      puVar7 = (ulong *)((long)puVar36 + (uVar37 & 0xfffffffffffffffe) * 4);
      local_c98 = (ulong *)CONCAT44(local_c98._4_4_,uVar33);
      if (uVar37 < 0x201) {
        if (uVar37 < 0x21) {
          uVar22 = *puVar36;
          uVar12 = *puVar7;
          local_cc0 = puVar7;
          uVar27 = uVar12;
          if ((long)ISAd[uVar12] < (long)ISAd[uVar22]) {
            local_cc0 = puVar36;
            uVar27 = uVar22;
          }
          if ((long)ISAd[*puVar14] < (long)ISAd[uVar27]) {
            if ((long)ISAd[uVar22] <= (long)ISAd[uVar12]) {
              puVar7 = puVar36;
              uVar12 = uVar22;
            }
            local_cc0 = puVar14;
            if ((long)ISAd[*puVar14] < (long)ISAd[uVar12]) {
              local_cc0 = puVar7;
            }
          }
        }
        else {
          uVar22 = uVar37 * 2 & 0xfffffffffffffff8;
          puVar23 = (ulong *)((long)puVar14 - uVar22);
          uVar12 = *(ulong *)((long)puVar36 + uVar22);
          if ((long)ISAd[*puVar7] < (long)ISAd[*(ulong *)((long)puVar36 + uVar22)]) {
            uVar12 = *puVar7;
          }
          puVar16 = puVar7;
          puVar17 = (ulong *)((long)puVar36 + uVar22);
          if ((long)ISAd[*puVar7] < (long)ISAd[*(ulong *)((long)puVar36 + uVar22)]) {
            puVar16 = (ulong *)((long)puVar36 + uVar22);
            puVar17 = puVar7;
          }
          uVar22 = *puVar14;
          puVar7 = puVar23;
          if ((long)ISAd[*puVar23] <= (long)ISAd[uVar22]) {
            puVar7 = puVar14;
            uVar22 = *puVar23;
            puVar14 = puVar23;
          }
          puVar23 = puVar7;
          if ((long)ISAd[uVar22] < (long)ISAd[uVar12]) {
            puVar23 = puVar16;
            puVar16 = puVar7;
            puVar14 = puVar17;
          }
          uVar22 = *puVar36;
          puVar7 = puVar16;
          uVar12 = uVar22;
          local_cc0 = puVar36;
          if ((long)ISAd[*puVar16] < (long)ISAd[uVar22]) {
            puVar7 = puVar36;
            uVar12 = *puVar16;
            local_cc0 = puVar16;
          }
          if ((long)ISAd[uVar12] <= (long)ISAd[*puVar14]) {
            local_cc0 = puVar14;
            puVar23 = puVar7;
          }
          if ((long)ISAd[*puVar23] <= (long)ISAd[*local_cc0]) {
            local_cc0 = puVar23;
          }
        }
      }
      else {
        uVar26 = uVar37 >> 3;
        uVar22 = *puVar36;
        uVar27 = ISAd[uVar22];
        uVar15 = *(ulong *)((long)puVar36 + (uVar37 & 0xfffffffffffffff8));
        uVar31 = ISAd[uVar15];
        uVar38 = uVar15;
        if ((long)uVar31 < (long)uVar27) {
          uVar38 = uVar22;
        }
        puVar23 = (ulong *)((long)puVar36 + (uVar37 & 0xfffffffffffffff8));
        local_c40 = puVar23;
        if ((long)uVar31 < (long)uVar27) {
          local_c40 = puVar36;
        }
        if ((long)ISAd[puVar36[uVar26 * 2]] < (long)ISAd[uVar38]) {
          if ((long)uVar27 <= (long)uVar31) {
            puVar23 = puVar36;
            uVar15 = uVar22;
          }
          local_c40 = puVar23;
          if ((long)ISAd[uVar15] <= (long)ISAd[puVar36[uVar26 * 2]]) {
            local_c40 = puVar36 + uVar26 * 2;
          }
        }
        puVar17 = puVar7 + -uVar26;
        uVar27 = *puVar17;
        uVar15 = *puVar7;
        puVar23 = puVar7;
        uVar31 = uVar15;
        if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
          puVar23 = puVar17;
          uVar31 = uVar27;
        }
        if ((long)ISAd[puVar7[uVar26]] < (long)ISAd[uVar31]) {
          if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
            puVar17 = puVar7;
            uVar27 = uVar15;
          }
          puVar23 = puVar17;
          if ((long)ISAd[uVar27] <= (long)ISAd[puVar7[uVar26]]) {
            puVar23 = puVar7 + uVar26;
          }
        }
        puVar7 = puVar14 + -uVar26;
        uVar27 = puVar14[uVar26 * -2];
        uVar15 = *puVar7;
        puVar17 = puVar7;
        uVar31 = uVar15;
        if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
          puVar17 = puVar14 + uVar26 * -2;
          uVar31 = uVar27;
        }
        uVar31 = ISAd[uVar31];
        if ((long)ISAd[*puVar14] < (long)uVar31) {
          puVar16 = puVar14 + uVar26 * -2;
          if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
            puVar16 = puVar7;
            uVar27 = uVar15;
          }
          puVar17 = puVar14;
          if ((long)ISAd[*puVar14] < (long)ISAd[uVar27]) {
            puVar17 = puVar16;
          }
          uVar31 = ISAd[*puVar17];
        }
        uVar27 = *local_c40;
        uVar15 = *puVar23;
        local_cc0 = puVar23;
        uVar38 = uVar15;
        if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
          local_cc0 = local_c40;
          uVar38 = uVar27;
        }
        local_cb8 = uVar12;
        local_c80 = uVar22;
        if ((long)uVar31 < (long)ISAd[uVar38]) {
          puVar7 = local_c40;
          if ((long)ISAd[uVar15] < (long)ISAd[uVar27]) {
            puVar7 = puVar23;
            uVar27 = uVar15;
          }
          local_cc0 = puVar17;
          if ((long)uVar31 < (long)ISAd[uVar27]) {
            local_cc0 = puVar7;
          }
        }
      }
      *puVar36 = *local_cc0;
      *local_cc0 = uVar22;
      uVar12 = ISAd[*puVar36];
      tr_partition((saidx64_t *)ISAd,(saidx64_t *)puVar36,(saidx64_t *)(puVar36 + 1),
                   (saidx64_t *)puVar24,(saidx64_t **)&local_cc0,(saidx64_t **)&local_cb0,uVar12);
      uVar22 = (long)local_cb0 - (long)local_cc0 >> 3;
      puVar14 = local_cc0;
      puVar7 = puVar36;
      ISA = local_ca8;
      if (uVar37 != uVar22) {
        uVar33 = 0xffffffff;
        if (local_ca8[*local_cc0] != uVar12) {
          if (uVar22 >> 0x20 == 0) {
            if (uVar22 < 0x10000) {
              if (uVar22 < 0x100) {
                uVar33 = lg_table[uVar22];
              }
              else {
                uVar33 = lg_table[uVar22 >> 8] + 8;
              }
            }
            else if (uVar22 < 0x1000000) {
              uVar33 = lg_table[uVar22 >> 0x10] + 0x10;
            }
            else {
              uVar33 = lg_table[uVar22 >> 0x18] + 0x18;
            }
          }
          else if (uVar22 < 0x1000000000000) {
            if (uVar22 < 0x10000000000) {
              uVar33 = lg_table[uVar22 >> 0x20] + 0x20;
            }
            else {
              uVar33 = lg_table[uVar22 >> 0x28] + 0x28;
            }
          }
          else if (uVar22 < 0x100000000000000) {
            uVar33 = lg_table[uVar22 >> 0x30] + 0x30;
          }
          else {
            uVar33 = lg_table[uVar22 >> 0x38] + 0x38;
          }
        }
        if (puVar36 < local_cc0) {
          puVar23 = puVar36;
          do {
            local_ca8[*puVar23] = ((long)local_cc0 - (long)SA >> 3) + -1;
            puVar23 = puVar23 + 1;
          } while (puVar23 < local_cc0);
        }
        if ((local_cb0 < local_ca0) && (local_cc0 < local_cb0)) {
          puVar23 = local_cc0;
          do {
            local_ca8[*puVar23] = ((long)local_cb0 - (long)SA >> 3) + -1;
            puVar23 = puVar23 + 1;
          } while (puVar23 < local_cb0);
        }
        uVar32 = (int)local_c98 - 1;
        if (1 < (long)uVar22) {
          if (sVar30 < (long)uVar22) {
            if (local_cf0 == 0) {
              local_cc8 = local_cc8 + uVar22;
              goto LAB_00118892;
            }
            sVar30 = sVar30 + n;
            local_cf0 = local_cf0 + -1;
          }
          sVar30 = sVar30 - uVar22;
          lVar8 = (long)local_cc0 - (long)puVar36 >> 3;
          lVar18 = (long)local_ca0 - (long)local_cb0 >> 3;
          if (lVar18 < lVar8) {
            if ((long)uVar22 < lVar8) {
              if ((long)uVar22 < lVar18) {
                lVar8 = (long)(int)uVar5;
                local_c38[lVar8 * 4] = (ulong)ISAd;
                local_c38[lVar8 * 4 + 1] = (ulong)puVar36;
                auStack_c20[lVar8 * 4 + -1] = (ulong)local_cc0;
                *(uint *)(auStack_c20 + lVar8 * 4) = uVar32;
                *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
                auStack_c20[lVar8 * 4 + 1] = (ulong)ISAd;
                auStack_c20[lVar8 * 4 + 2] = (ulong)local_cb0;
                *(ulong **)(auStack_c00 + lVar8 * 8 + -2) = local_ca0;
LAB_00118bbb:
                auStack_c00[(long)(int)uVar5 * 8] = uVar32;
                auStack_c00[(long)(int)uVar5 * 8 + 1] = uVar19;
                puVar10 = ISAd + lVar13;
                puVar7 = local_cc0;
                puVar23 = local_cb0;
                uVar6 = (ulong)(uVar5 + 2);
              }
              else {
                lVar8 = (long)(int)uVar5;
                local_c38[lVar8 * 4] = (ulong)ISAd;
                local_c38[lVar8 * 4 + 1] = (ulong)puVar36;
                auStack_c20[lVar8 * 4 + -1] = (ulong)local_cc0;
                *(uint *)(auStack_c20 + lVar8 * 4) = uVar32;
                *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
                if (lVar18 < 2) {
LAB_00119950:
                  puVar10 = ISAd + lVar13;
                  puVar7 = local_cc0;
                  puVar23 = local_cb0;
                  uVar6 = (ulong)(uVar5 + 1);
                }
                else {
                  lVar8 = (long)(int)(uVar5 + 1);
                  local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
                  local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
                  auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
                  *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
                  *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
                  puVar7 = local_cb0;
                  puVar23 = local_ca0;
                  uVar6 = (ulong)(uVar5 + 2);
                  uVar33 = uVar32;
                }
              }
            }
            else if (lVar18 < 2) {
              puVar10 = ISAd + lVar13;
              puVar7 = local_cc0;
              puVar23 = local_cb0;
              if (1 < lVar8) {
                lVar8 = (long)(int)uVar5;
                local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
                local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
                auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
                *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
                *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
                puVar10 = ISAd;
                puVar7 = puVar36;
                puVar23 = local_cc0;
                uVar6 = (ulong)(uVar5 + 1);
                uVar33 = uVar32;
              }
            }
            else {
              lVar8 = (long)(int)uVar5;
              local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
              local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
              auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
              *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
              *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
              auStack_c20[lVar8 * 4 + 1] = (ulong)ISAd;
              auStack_c20[lVar8 * 4 + 2] = (ulong)puVar36;
              *(ulong **)(auStack_c00 + lVar8 * 8 + -2) = local_cc0;
              auStack_c00[lVar8 * 8] = uVar32;
              auStack_c00[lVar8 * 8 + 1] = uVar19;
              puVar7 = local_cb0;
              puVar23 = local_ca0;
              uVar6 = (ulong)(uVar5 + 2);
              uVar33 = uVar32;
            }
            goto LAB_00117da3;
          }
          if ((long)uVar22 < lVar18) {
            if ((long)uVar22 < lVar8) {
              lVar8 = (long)(int)uVar5;
              local_c38[lVar8 * 4] = (ulong)ISAd;
              local_c38[lVar8 * 4 + 1] = (ulong)local_cb0;
              auStack_c20[lVar8 * 4 + -1] = (ulong)local_ca0;
              *(uint *)(auStack_c20 + lVar8 * 4) = uVar32;
              *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
              auStack_c20[lVar8 * 4 + 1] = (ulong)ISAd;
              auStack_c20[lVar8 * 4 + 2] = (ulong)puVar36;
              *(ulong **)(auStack_c00 + lVar8 * 8 + -2) = local_cc0;
              goto LAB_00118bbb;
            }
            lVar18 = (long)(int)uVar5;
            local_c38[lVar18 * 4] = (ulong)ISAd;
            local_c38[lVar18 * 4 + 1] = (ulong)local_cb0;
            auStack_c20[lVar18 * 4 + -1] = (ulong)local_ca0;
            *(uint *)(auStack_c20 + lVar18 * 4) = uVar32;
            *(uint *)((long)auStack_c20 + (lVar18 * 8 + 1) * 4) = uVar19;
            if (lVar8 < 2) goto LAB_00119950;
            lVar8 = (long)(int)(uVar5 + 1);
            local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
            local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
            *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
          }
          else {
            if (lVar8 < 2) {
              puVar10 = ISAd + lVar13;
              puVar7 = local_cc0;
              puVar23 = local_cb0;
              if (1 < lVar18) {
                lVar8 = (long)(int)uVar5;
                local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
                local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
                auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
                *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
                *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
                puVar10 = ISAd;
                puVar7 = local_cb0;
                puVar23 = local_ca0;
                uVar6 = (ulong)(uVar5 + 1);
                uVar33 = uVar32;
              }
              goto LAB_00117da3;
            }
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = (ulong)(ISAd + lVar13);
            local_c38[lVar8 * 4 + 1] = (ulong)local_cc0;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_cb0;
            *(uint *)(auStack_c20 + lVar8 * 4) = uVar33;
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
            auStack_c20[lVar8 * 4 + 1] = (ulong)ISAd;
            auStack_c20[lVar8 * 4 + 2] = (ulong)local_cb0;
            *(ulong **)(auStack_c00 + lVar8 * 8 + -2) = local_ca0;
            auStack_c00[lVar8 * 8] = uVar32;
            auStack_c00[lVar8 * 8 + 1] = uVar19;
          }
          puVar23 = local_cc0;
          uVar6 = (ulong)(uVar5 + 2);
          uVar33 = uVar32;
          goto LAB_00117da3;
        }
LAB_00118892:
        if ((8 < (long)local_cb0 - (long)local_cc0) && (-1 < (int)uVar19)) {
          *(undefined4 *)(auStack_c20 + (ulong)uVar19 * 4) = 0xffffffff;
        }
        puVar17 = (ulong *)((long)local_cc0 - (long)puVar36 >> 3);
        puVar24 = (ulong *)((long)local_ca0 - (long)local_cb0 >> 3);
        if ((long)puVar24 < (long)puVar17) {
          puVar23 = local_cc0;
          puVar16 = puVar17;
          if (1 < (long)puVar24) {
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = (ulong)ISAd;
            local_c38[lVar8 * 4 + 1] = (ulong)puVar36;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_cc0;
            *(uint *)(auStack_c20 + lVar8 * 4) = uVar32;
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
            puVar7 = local_cb0;
            puVar23 = local_ca0;
            uVar6 = (ulong)(uVar5 + 1);
            uVar33 = uVar32;
            goto LAB_00117da3;
          }
        }
        else {
          puVar7 = local_cb0;
          puVar23 = local_ca0;
          puVar16 = puVar24;
          if (1 < (long)puVar17) {
            lVar8 = (long)(int)uVar5;
            local_c38[lVar8 * 4] = (ulong)ISAd;
            local_c38[lVar8 * 4 + 1] = (ulong)local_cb0;
            auStack_c20[lVar8 * 4 + -1] = (ulong)local_ca0;
            *(uint *)(auStack_c20 + lVar8 * 4) = uVar32;
            *(uint *)((long)auStack_c20 + (lVar8 * 8 + 1) * 4) = uVar19;
            puVar7 = puVar36;
            puVar23 = local_cc0;
            uVar6 = (ulong)(uVar5 + 1);
            uVar33 = uVar32;
            goto LAB_00117da3;
          }
        }
        uVar33 = uVar32;
        if (1 < (long)puVar16) goto LAB_00117da3;
        goto LAB_0011916e;
      }
      if ((long)uVar37 <= sVar30) {
LAB_00118820:
        if (uVar37 >> 0x20 == 0) {
          if (uVar37 < 0x10000) {
            if (uVar37 < 0x100) {
              uVar33 = lg_table[uVar37];
            }
            else {
              uVar33 = lg_table[uVar37 >> 8] + 8;
            }
          }
          else if (uVar37 < 0x1000000) {
            uVar33 = lg_table[uVar37 >> 0x10] + 0x10;
          }
          else {
            uVar33 = lg_table[uVar37 >> 0x18] + 0x18;
          }
        }
        else if (uVar37 < 0x1000000000000) {
          if (uVar37 < 0x10000000000) {
            uVar33 = lg_table[uVar37 >> 0x20] + 0x20;
          }
          else {
            uVar33 = lg_table[uVar37 >> 0x28] + 0x28;
          }
        }
        else if (uVar37 < 0x100000000000000) {
          uVar33 = lg_table[uVar37 >> 0x30] + 0x30;
        }
        else {
          uVar33 = lg_table[uVar37 >> 0x38] + 0x38;
        }
        sVar30 = sVar30 - uVar37;
        puVar10 = ISAd + lVar13;
        puVar23 = local_ca0;
        goto LAB_00117da3;
      }
      if (local_cf0 != 0) {
        sVar30 = sVar30 + n;
        local_cf0 = local_cf0 + -1;
        goto LAB_00118820;
      }
      if (-1 < (int)uVar19) {
        *(undefined4 *)(auStack_c20 + (ulong)uVar19 * 4) = 0xffffffff;
      }
      local_cc8 = local_cc8 + uVar37;
      if (uVar5 != 0) {
LAB_001190bc:
        lVar8 = (long)(int)uVar5;
        uVar19 = *(uint *)((long)local_c38 + lVar8 * 0x20 + -4);
        local_cf0 = 0;
        puVar14 = local_cc0;
        puVar10 = local_c58[lVar8 * 4];
        puVar7 = local_c58[lVar8 * 4 + 1];
        puVar23 = local_c58[lVar8 * 4 + 2];
        uVar6 = (ulong)(uVar5 - 1);
        uVar33 = (uint)local_c38[lVar8 * 4 + -1];
        goto LAB_00117da3;
      }
      local_cf0 = 0;
      puVar14 = extraout_RDX;
LAB_0011999f:
      puVar10 = local_c70[1];
      puVar7 = local_c70[0];
      if (local_cc8 == 0) {
        uVar12 = (long)local_c60 - (long)local_c58[0] >> 3;
        goto LAB_001199dc;
      }
      local_c88 = local_c88 + local_cc8;
      if (local_c70[0] <= local_c58[0]) goto LAB_00119a02;
      uVar12 = 0;
    }
    uVar6 = *local_c58[0];
    local_c60 = local_c58[0];
  } while( true );
  if (uVar12 != 0) {
    local_c58[0][uVar12] = uVar12;
  }
LAB_00119a02:
  if (local_c88 == 0) {
    return;
  }
  puVar10 = puVar10 + lVar13;
  uVar6 = *SA;
  if ((long)uVar6 <= (long)local_c78) {
    return;
  }
  goto LAB_00117c26;
}

Assistant:

void
trsort(saidx_t *ISA, saidx_t *SA, saidx_t n, saidx_t depth) {
  saidx_t *ISAd;
  saidx_t *first, *last;
  trbudget_t budget;
  saidx_t t, skip, unsorted;

  trbudget_init(&budget, tr_ilg(n) * 2 / 3, n);
/*  trbudget_init(&budget, tr_ilg(n) * 3 / 4, n); */
  for(ISAd = ISA + depth; -n < *SA; ISAd += ISAd - ISA) {
    first = SA;
    skip = 0;
    unsorted = 0;
    do {
      if((t = *first) < 0) { first -= t; skip += t; }
      else {
        if(skip != 0) { *(first + skip) = skip; skip = 0; }
        last = SA + ISA[t] + 1;
        if(1 < (last - first)) {
          budget.count = 0;
          tr_introsort(ISA, ISAd, SA, first, last, &budget);
          if(budget.count != 0) { unsorted += budget.count; }
          else { skip = first - last; }
        } else if((last - first) == 1) {
          skip = -1;
        }
        first = last;
      }
    } while(first < (SA + n));
    if(skip != 0) { *(first + skip) = skip; }
    if(unsorted == 0) { break; }
  }
}